

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cc
# Opt level: O2

Symbol __thiscall avro::parsing::Symbol::error(Symbol *this,NodePtr *writer,NodePtr *reader)

{
  ostream *poVar1;
  any extraout_RDX;
  Symbol SVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1b8;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar1 = std::operator<<((ostream *)&oss,"Cannot resolve: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  (*writer->px->_vptr_Node[0xd])(writer->px,&oss,0);
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&oss);
  poVar1 = std::operator<<(poVar1,"with");
  std::endl<char,std::char_traits<char>>(poVar1);
  (*reader->px->_vptr_Node[0xd])(reader->px,&oss,0);
  std::__cxx11::stringbuf::str();
  Symbol<std::__cxx11::string>(this,sError,&bStack_1b8);
  std::__cxx11::string::~string((string *)&bStack_1b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  SVar2.extra_.content = extraout_RDX.content;
  SVar2._0_8_ = this;
  return SVar2;
}

Assistant:

Symbol Symbol::error(const NodePtr& writer, const NodePtr& reader)
{
    ostringstream oss;
    oss << "Cannot resolve: " << std::endl;
    writer->printJson(oss, 0);
    oss << std::endl << "with" << std::endl;
    reader->printJson(oss, 0);
    return Symbol(sError, oss.str());
}